

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)9,QRgbaFloat<float>>
               (QRgbaFloat<float> *buf1,QRgbaFloat<float> *buf2,ushort *distxs,ushort *distys,
               int len,QTextureData *image,qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,
               qreal fdw)

{
  undefined8 *puVar1;
  uint uVar2;
  uchar *puVar3;
  double dVar4;
  double __x;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  double __x_00;
  double dVar17;
  
  if (0 < len) {
    dVar17 = *fw;
    lVar16 = 8;
    uVar15 = 0;
    do {
      dVar17 = (double)(-(ulong)(dVar17 == 0.0) & 0x40d0000000000000 |
                       ~-(ulong)(dVar17 == 0.0) & (ulong)(1.0 / dVar17));
      __x = *fx * dVar17 + -0.5;
      __x_00 = dVar17 * *fy + -0.5;
      dVar17 = floor(__x);
      dVar4 = floor(__x_00);
      distxs[uVar15] = (ushort)(int)((__x - (double)(int)dVar17) * 65536.0);
      distys[uVar15] = (ushort)(int)((__x_00 - (double)(int)dVar4) * 65536.0);
      uVar9 = image->width;
      iVar6 = (int)dVar17 % (int)uVar9;
      uVar7 = iVar6 >> 0x1f & uVar9;
      uVar13 = uVar7 + iVar6 + 1;
      uVar2 = image->height;
      if (uVar13 == uVar9) {
        uVar13 = 0;
      }
      iVar11 = (int)dVar4 % (int)uVar2;
      uVar8 = iVar11 >> 0x1f & uVar2;
      uVar9 = uVar8 + iVar11 + 1;
      if (uVar9 == uVar2) {
        uVar9 = 0;
      }
      lVar14 = (long)(int)(uVar8 + iVar11) * image->bytesPerLine;
      lVar10 = (long)(int)uVar9 * image->bytesPerLine;
      puVar3 = image->imageData;
      lVar12 = (long)(int)(uVar7 + iVar6) * 0x10;
      uVar5 = *(undefined8 *)(puVar3 + lVar12 + lVar14 + 8);
      puVar1 = (undefined8 *)((long)&buf1[-1].r + lVar16 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + lVar12 + lVar14);
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)(puVar3 + (long)(int)uVar13 * 0x10 + lVar14 + 8);
      puVar1 = (undefined8 *)((long)&buf1->r + lVar16 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + (long)(int)uVar13 * 0x10 + lVar14);
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)(puVar3 + lVar12 + lVar10 + 8);
      puVar1 = (undefined8 *)((long)&buf2[-1].r + lVar16 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + lVar12 + lVar10);
      puVar1[1] = uVar5;
      uVar5 = *(undefined8 *)(puVar3 + (long)(int)uVar13 * 0x10 + lVar10 + 8);
      puVar1 = (undefined8 *)((long)&buf2->r + lVar16 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + (long)(int)uVar13 * 0x10 + lVar10);
      puVar1[1] = uVar5;
      *fx = *fx + fdx;
      *fy = *fy + fdy;
      dVar17 = *fw + fdw;
      *fw = dVar17;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x10;
    } while ((uint)len != uVar15);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}